

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O0

void __thiscall gss::innards::Proof::create_non_edge_constraint(Proof *this,int p,int q)

{
  pointer pIVar1;
  pair<int,_int> *__args;
  mapped_type *pmVar2;
  ostream *poVar3;
  ostream *poVar4;
  int in_EDX;
  int in_ESI;
  long *in_stack_ffffffffffffff90;
  map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
  *__args_1;
  pair<int,_int> local_40;
  key_type_conflict1 *in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd1;
  pair<int,_int> local_28;
  long local_20;
  long local_18;
  int local_10;
  int local_c [3];
  
  local_10 = in_EDX;
  local_c[0] = in_ESI;
  pIVar1 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x1963c0);
  __args = (pair<int,_int> *)std::operator<<((ostream *)&pIVar1->field_0x50,"-1 x");
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x1963e6);
  local_18 = (long)local_c[0];
  pmVar2 = std::
           map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffc8);
  poVar3 = std::operator<<((ostream *)__args,(string *)pmVar2);
  poVar3 = std::operator<<(poVar3," -1 x");
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x19642f);
  local_20 = (long)local_10;
  pmVar2 = std::
           map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffc8);
  poVar4 = std::operator<<(poVar3,(string *)pmVar2);
  std::operator<<(poVar4," >= -1 ;\n");
  pIVar1 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x196473);
  pIVar1->nb_constraints = pIVar1->nb_constraints + 1;
  pIVar1 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x19648f);
  if ((pIVar1->recover_encoding & 1U) == 0) {
    std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
    operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                *)0x1964a6);
    std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_28,local_c,&local_10);
    std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
    operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                *)0x1964ce);
    std::
    map<std::pair<long,long>,long,std::less<std::pair<long,long>>,std::allocator<std::pair<std::pair<long,long>const,long>>>
    ::emplace<std::pair<int,int>,long&>
              ((map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
                *)poVar3,__args,in_stack_ffffffffffffff90);
    pIVar1 = std::
             unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
             operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x1964f9);
    __args_1 = &pIVar1->non_edge_constraints;
    std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_40,&local_10,local_c);
    std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
    operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                *)0x196522);
    std::
    map<std::pair<long,long>,long,std::less<std::pair<long,long>>,std::allocator<std::pair<std::pair<long,long>const,long>>>
    ::emplace<std::pair<int,int>,long&>
              ((map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
                *)poVar3,__args,(long *)__args_1);
  }
  return;
}

Assistant:

auto Proof::create_non_edge_constraint(int p, int q) -> void
{
    _imp->model_stream << "-1 x" << _imp->binary_variable_mappings[p] << " -1 x" << _imp->binary_variable_mappings[q] << " >= -1 ;\n";

    ++_imp->nb_constraints;
    if (! _imp->recover_encoding) {
        _imp->non_edge_constraints.emplace(pair{p, q}, _imp->nb_constraints);
        _imp->non_edge_constraints.emplace(pair{q, p}, _imp->nb_constraints);
    }
}